

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

bool __thiscall mjs::gc_heap::type_check<mjs::gc_string>(gc_heap *this,uint32_t pos)

{
  slot_allocation_header sVar1;
  slot *psVar2;
  char *pcVar3;
  uint32_t pos_00;
  undefined4 uStack_18;
  slot_allocation_header a;
  uint32_t pos_local;
  gc_heap *this_local;
  
  pos_00 = pos - 1;
  psVar2 = get_at(this,pos_00);
  sVar1 = psVar2->allocation;
  pcVar3 = gc_type_info_registration<mjs::gc_string>::index((char *)this,pos_00);
  uStack_18 = sVar1.type;
  return (uint32_t)pcVar3 == uStack_18;
}

Assistant:

bool type_check(uint32_t pos) const {
        const auto a = get_at(pos-1)->allocation;
        if constexpr (std::is_convertible_v<T*, object*>) {
            // Avoid creating gc_type_info_registration<T>'s for interface types
            return a.type_info().is_convertible_to_object() && dynamic_cast<T*>(reinterpret_cast<object*>(get_at(pos)));
        } else {
            return gc_type_info_registration<T>::index()  == a.type;
        }
    }